

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagSet::add(TagSet *this,Tag *tag)

{
  string local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  local_60;
  Tag *local_18;
  Tag *tag_local;
  TagSet *this_local;
  
  local_18 = tag;
  tag_local = (Tag *)this;
  Tag::getName_abi_cxx11_(&local_80,tag);
  std::make_pair<std::__cxx11::string,Catch::Tag_const&>(&local_60,&local_80,local_18);
  std::
  map<std::__cxx11::string,Catch::Tag,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
  ::insert<std::pair<std::__cxx11::string,Catch::Tag>>
            ((map<std::__cxx11::string,Catch::Tag,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
              *)this,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  ::~pair(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void add( const Tag& tag ) {
            m_tags.insert( std::make_pair( tag.getName(), tag ) );
        }